

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

double __thiscall
imrt::EvaluationFunction::incremental_eval
          (EvaluationFunction *this,Station *station,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *plVar1;
  size_t *psVar2;
  double dVar3;
  long lVar4;
  Matrix *pMVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_80;
  
  this->prev_F = this->F;
  plVar1 = &this->Z_diff;
  p_Var6 = (this->Z_diff).
           super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var6 != (_List_node_base *)plVar1) {
    p_Var10 = p_Var6->_M_next;
    operator_delete(p_Var6);
    p_Var6 = p_Var10;
  }
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  if (this->nb_organs < 1) {
    local_80 = 0.0;
  }
  else {
    uVar7 = 0;
    local_80 = 0.0;
    do {
      pMVar5 = Station::getDepositionMatrix(station,(int)uVar7);
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7]) {
        lVar8 = 0;
        do {
          p_Var6 = (diff->
                   super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (p_Var6 == (_List_node_base *)diff) {
            p_Var10 = (_List_node_base *)0x0;
          }
          else {
            p_Var10 = (_List_node_base *)0x0;
            do {
              uVar9 = -(ulong)(pMVar5->p[lVar8][*(int *)&p_Var6[1]._M_next] == 0.0);
              p_Var10 = (_List_node_base *)
                        (uVar9 & (ulong)p_Var10 |
                        ~uVar9 & (ulong)((double)p_Var6[1]._M_prev *
                                         pMVar5->p[lVar8][*(int *)&p_Var6[1]._M_next] +
                                        (double)p_Var10));
              p_Var6 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var6 != (_List_node_base *)diff);
          }
          if (((double)p_Var10 != 0.0) || (NAN((double)p_Var10))) {
            dVar11 = *(double *)
                      (*(long *)&(this->Z).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar8 * 8);
            dVar3 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            dVar12 = (double)p_Var10 + dVar11;
            if ((dVar3 <= dVar11) || (dVar3 <= dVar12)) {
              if (dVar3 <= dVar11) {
                dVar11 = 0.0;
                if (dVar12 < dVar3) {
                  dVar11 = (dVar3 - dVar12) * (dVar3 - dVar12) *
                           (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar7] + 0.0;
                }
              }
              else {
                dVar11 = 0.0 - (dVar3 - dVar11) * (dVar3 - dVar11) *
                               (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar7];
              }
            }
            else {
              dVar11 = ((dVar11 - dVar3) + (dVar11 - dVar3) + (double)p_Var10) *
                       (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar7] * (double)p_Var10 + 0.0;
            }
            dVar3 = *(double *)
                     (*(long *)&(this->Z).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar8 * 8);
            dVar12 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            dVar13 = (double)p_Var10 + dVar3;
            if ((dVar3 <= dVar12) || (dVar13 <= dVar12)) {
              if (dVar3 <= dVar12) {
                if (dVar12 < dVar13) {
                  dVar11 = dVar11 + (dVar13 - dVar12) * (dVar13 - dVar12) *
                                    (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                    .super__Vector_impl_data._M_start[uVar7];
                }
              }
              else {
                dVar11 = dVar11 - (dVar3 - dVar12) * (dVar3 - dVar12) *
                                  (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[uVar7];
              }
            }
            else {
              dVar11 = dVar11 + ((dVar3 - dVar12) + (dVar3 - dVar12) + (double)p_Var10) *
                                (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[uVar7] * (double)p_Var10;
            }
            local_80 = local_80 +
                       dVar11 / (double)(this->nb_voxels).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar7];
            lVar4 = *(long *)&(this->Z).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            *(double *)(lVar4 + lVar8 * 8) = *(double *)(lVar4 + lVar8 * 8) + (double)p_Var10;
            update_sorted_voxels(this,w,Zmin,Zmax,(int)uVar7,(int)lVar8);
            p_Var6 = (_List_node_base *)operator_new(0x20);
            p_Var6[1]._M_next = (_List_node_base *)(lVar8 << 0x20 | uVar7);
            p_Var6[1]._M_prev = p_Var10;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar2 = &(this->Z_diff).
                      super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                      ._M_impl._M_node._M_size;
            *psVar2 = *psVar2 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)this->nb_organs);
  }
  local_80 = local_80 + this->F;
  this->F = local_80;
  n_evaluations = n_evaluations + 1;
  return local_80;
}

Assistant:

double EvaluationFunction::incremental_eval(Station& station, vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, list< pair< int, double > >& diff){

  prev_F=F; Z_diff.clear();
  double delta_F=0.0;

  //for each voxel we compute the change produced by the modified beamlets
  //while at the same time we compute the variation in the function F produced by all these changes

  for(int o=0; o<nb_organs; o++){
		const Matrix&  Dep = station.getDepositionMatrix(o);
		for(int k=0; k<nb_voxels[o]; k++){

		//we compute the change in the delivered dose in voxel k of the organ o
		double delta=0.0;

		//cout << station.changed_lets.size() << endl;
		for (auto let:diff){
		    int b=let.first;
			  if(Dep(k,b)==0.0) continue;
				delta+= Dep(k,b)*let.second;
		}


		if(delta==0.0) continue; //no change in the voxel


		double pen=0.0;
		//with the change in the dose of a voxel we can incrementally modify the value of F
		if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
		else if(Z[o][k] < Zmin[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
		else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

		if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
		else if(Z[o][k] > Zmax[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
		else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
			pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

		delta_F += pen/nb_voxels[o];
		Z[o][k] += delta;

    double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);

		//we save the last changes (see undo_last_eval)
		Z_diff.push_back(make_pair(make_pair(o,k),delta));
	}
  }

  F+=delta_F;
  n_evaluations++;
  return F;

}